

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O2

void __thiscall irr::gui::CGUISpriteBank::~CGUISpriteBank(CGUISpriteBank *this)

{
  ~CGUISpriteBank(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

CGUISpriteBank::~CGUISpriteBank()
{
	clear();

	// drop video driver
	if (Driver)
		Driver->drop();
}